

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void __thiscall Draw::PrintNumAlignCenter(Draw *this,int num,int w,bool Zero)

{
  int iVar1;
  ostream *this_00;
  int local_30;
  int local_2c;
  int i_2;
  int i_1;
  int tnum;
  int len;
  int i;
  bool Zero_local;
  int w_local;
  int num_local;
  Draw *this_local;
  
  if ((num != 0) || (Zero)) {
    i_1 = 0;
    for (i_2 = num; i_2 != 0; i_2 = i_2 / 10) {
      i_1 = i_1 + 1;
    }
    if (num == 0) {
      i_1 = 1;
    }
    if (w < i_1) {
      this_00 = std::operator<<((ostream *)&std::cout,"ERROR");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    else {
      iVar1 = w - i_1;
      for (local_2c = 0; local_2c < iVar1 - iVar1 / 2; local_2c = local_2c + 1) {
        std::operator<<((ostream *)&std::cout,' ');
      }
      std::ostream::operator<<((ostream *)&std::cout,num);
      for (local_30 = 0; local_30 < iVar1 / 2; local_30 = local_30 + 1) {
        std::operator<<((ostream *)&std::cout,' ');
      }
    }
  }
  else {
    for (tnum = 0; tnum < w; tnum = tnum + 1) {
      std::operator<<((ostream *)&std::cout,' ');
    }
  }
  return;
}

Assistant:

void Draw::PrintNumAlignCenter(int num, int w, bool Zero) {
    if (num == 0 && !Zero) {
        for (int i = 0; i < w; i++)
            std::cout << ' ';
        return;
    }
    int len = 0, tnum = num;
    while (tnum) {
        tnum /= 10;
        len++;
    }
    if (num == 0)
        len = 1;
    if (w < len) {
        std::cout << "ERROR" << std::endl;
        return;
    }
    w -= len;
    for (int i = 0; i < w - w / 2; i++)
        std::cout << ' ';
    std::cout << num;
    for (int i = 0; i < w / 2; i++)
        std::cout << ' ';
}